

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uchar *puVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  
  uVar7 = stbtt__GetGlyfOffset(font,glyph);
  if ((int)uVar7 < 0) {
    if (ix0 != (int *)0x0) {
      *ix0 = 0;
    }
    if (iy0 != (int *)0x0) {
      *iy0 = 0;
    }
    if (ix1 != (int *)0x0) {
      *ix1 = 0;
    }
    iVar8 = 0;
    if (iy1 == (int *)0x0) {
      return;
    }
  }
  else {
    puVar6 = font->data;
    uVar5 = *(ushort *)(puVar6 + (ulong)uVar7 + 6);
    bVar1 = puVar6[(ulong)uVar7 + 4];
    bVar2 = puVar6[(ulong)uVar7 + 5];
    bVar3 = puVar6[(ulong)uVar7 + 8];
    bVar4 = puVar6[(ulong)uVar7 + 9];
    if (ix0 != (int *)0x0) {
      fVar9 = floorf((float)(int)(short)(*(ushort *)(puVar6 + (ulong)uVar7 + 2) << 8 |
                                        *(ushort *)(puVar6 + (ulong)uVar7 + 2) >> 8) * scale_x + 0.0
                    );
      *ix0 = (int)fVar9;
    }
    if (iy0 != (int *)0x0) {
      fVar9 = floorf((float)(int)-((int)(short)((ushort)bVar3 << 8) | (uint)bVar4) * scale_y + 0.0);
      *iy0 = (int)fVar9;
    }
    if (ix1 != (int *)0x0) {
      fVar9 = ceilf((float)(int)(short)(uVar5 << 8 | uVar5 >> 8) * scale_x + 0.0);
      *ix1 = (int)fVar9;
    }
    if (iy1 == (int *)0x0) {
      return;
    }
    fVar9 = ceilf((float)(int)-((int)(short)((ushort)bVar1 << 8) | (uint)bVar2) * scale_y + 0.0);
    iVar8 = (int)fVar9;
  }
  *iy1 = iVar8;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}